

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O1

int mraa_spi_lookup(char *spi_name)

{
  int iVar1;
  char *__s;
  mraa_board_t *pmVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  
  pmVar2 = plat;
  if (((spi_name != (char *)0x0 && plat != (mraa_board_t *)0x0) && (*spi_name != '\0')) &&
     (iVar1 = plat->spi_bus_count, 0 < (long)iVar1)) {
    lVar5 = 0;
    do {
      __s = *(char **)((long)&pmVar2->spi_bus[0].name + lVar5);
      if (__s != (char *)0x0) {
        sVar4 = strlen(__s);
        iVar3 = strncmp(spi_name,__s,sVar4 + 1);
        if (iVar3 == 0) {
          return *(int *)((long)&pmVar2->spi_bus[0].bus_id + lVar5);
        }
      }
      lVar5 = lVar5 + 0x28;
    } while ((long)iVar1 * 0x28 != lVar5);
  }
  return -1;
}

Assistant:

int
mraa_spi_lookup(const char* spi_name)
{
    int i;

    if (plat == NULL) {
        return -1;
    }

    if (spi_name == NULL || strlen(spi_name) == 0) {
        return -1;
    }

    for (i = 0; i < plat->spi_bus_count; i++) {
        if (plat->spi_bus[i].name != NULL &&
            strncmp(spi_name, plat->spi_bus[i].name, strlen(plat->spi_bus[i].name) + 1) == 0) {
            return plat->spi_bus[i].bus_id;
        }
    }
    return -1;
}